

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_blindfactor.cpp
# Opt level: O0

void __thiscall
BlindFactor_Constractor_hex_empty_Test::TestBody(BlindFactor_Constractor_hex_empty_Test *this)

{
  bool bVar1;
  AssertHelper local_90;
  Message local_88 [2];
  CfdException *anon_var_0;
  string local_70 [32];
  undefined1 local_50 [8];
  BlindFactor blind_factor;
  char *pcStack_18;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  BlindFactor_Constractor_hex_empty_Test *this_local;
  
  gtest_msg.value = (char *)this;
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffe8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffe8);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"",(allocator *)((long)&anon_var_0 + 7));
      cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_50,local_70);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)((long)&anon_var_0 + 7));
      cfd::core::BlindFactor::~BlindFactor((BlindFactor *)local_50);
    }
    pcStack_18 = 
    "Expected: BlindFactor blind_factor(\"\") throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_88);
  testing::internal::AssertHelper::AssertHelper
            (&local_90,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_blindfactor.cpp"
             ,0x1c,pcStack_18);
  testing::internal::AssertHelper::operator=(&local_90,local_88);
  testing::internal::AssertHelper::~AssertHelper(&local_90);
  testing::Message::~Message(local_88);
  return;
}

Assistant:

TEST(BlindFactor, Constractor_hex_empty) {
  EXPECT_THROW(BlindFactor blind_factor(""), CfdException);
}